

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.cpp
# Opt level: O0

Token * number(void)

{
  char cVar1;
  bool bVar2;
  Token *in_RDI;
  
  while( true ) {
    cVar1 = peek();
    bVar2 = isDigit(cVar1);
    if (!bVar2) break;
    advance();
  }
  cVar1 = peek();
  if (cVar1 == '.') {
    cVar1 = peekNext();
    bVar2 = isDigit(cVar1);
    if (bVar2) {
      advance();
      while( true ) {
        cVar1 = peek();
        bVar2 = isDigit(cVar1);
        if (!bVar2) break;
        advance();
      }
    }
  }
  makeToken(in_RDI,TOKEN_NUMBER);
  return in_RDI;
}

Assistant:

static Token number() {
  while (isDigit(peek())) advance();

  // Look for a fractional part.
  if (peek() == '.' && isDigit(peekNext())) {
    // Consume the ".".
    advance();

    while (isDigit(peek())) advance();
  }

  return makeToken(TOKEN_NUMBER);
}